

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# progress.c
# Opt level: O2

int Curl_pgrsUpdate(connectdata *conn)

{
  Curl_easy *data;
  curl_xferinfo_callback p_Var1;
  curl_progress_callback p_Var2;
  FILE *whereto;
  double dVar3;
  long lVar4;
  ulong uVar5;
  time_t tVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  curl_off_t cVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  int iVar16;
  double dVar17;
  timeval newer;
  timeval older;
  long local_b0;
  long local_a8;
  char time_spent [10];
  char time_total [10];
  char time_left [10];
  char max5 [6] [10];
  
  data = conn->data;
  iVar12 = (data->progress).speeder_c;
  newer = curlx_tvnow();
  lVar4 = newer.tv_sec;
  dVar17 = curlx_tvdiff_secs(newer,(data->progress).start);
  (data->progress).timespent = dVar17;
  lVar7 = (data->progress).downloaded;
  lVar9 = (data->progress).lastshow;
  dVar3 = (double)(~-(ulong)(0.0 < dVar17) & 0x3ff0000000000000 |
                  -(ulong)(0.0 < dVar17) & (ulong)dVar17);
  lVar11 = (long)((double)lVar7 / dVar3);
  (data->progress).dlspeed = lVar11;
  lVar15 = (data->progress).uploaded;
  lVar13 = (long)((double)lVar15 / dVar3);
  (data->progress).ulspeed = lVar13;
  if (lVar9 != lVar4) {
    iVar12 = iVar12 % 6;
    if (lVar15 < lVar7) {
      lVar15 = lVar7;
    }
    (data->progress).lastshow = lVar4;
    (data->progress).speeder[iVar12] = lVar15;
    (data->progress).speeder_time[iVar12].tv_sec = lVar4;
    (data->progress).speeder_time[iVar12].tv_usec = newer.tv_usec;
    iVar16 = (data->progress).speeder_c;
    (data->progress).speeder_c = iVar16 + 1U;
    if (iVar16 == 0) {
      if (lVar11 < lVar13) {
        lVar11 = lVar13;
      }
    }
    else {
      uVar8 = (ulong)(iVar16 + 1U) % 6;
      if (iVar16 < 5) {
        uVar8 = 0;
      }
      uVar5 = (ulong)(uint)((int)uVar8 << 4);
      older.tv_usec = *(__suseconds_t *)((long)&(data->progress).speeder_time[0].tv_usec + uVar5);
      older.tv_sec = *(__time_t *)((long)&(data->progress).speeder_time[0].tv_sec + uVar5);
      tVar6 = curlx_tvdiff(newer,older);
      lVar11 = tVar6 + (ulong)(tVar6 == 0);
      lVar7 = (data->progress).speeder[iVar12] - (data->progress).speeder[uVar8];
      if (lVar7 < 0x418938) {
        lVar11 = (lVar7 * 1000) / lVar11;
      }
      else {
        lVar11 = (long)((double)lVar7 / ((double)lVar11 / 1000.0));
      }
    }
    (data->progress).current_speed = lVar11;
  }
  uVar14 = (data->progress).flags;
  if ((uVar14 & 0x10) != 0) {
    return 0;
  }
  p_Var1 = (data->set).fxferinfo;
  if (p_Var1 != (curl_xferinfo_callback)0x0) {
    iVar12 = (*p_Var1)((data->set).progress_client,(data->progress).size_dl,
                       (data->progress).downloaded,(data->progress).size_ul,
                       (data->progress).uploaded);
LAB_0010ab22:
    iVar16 = 0;
    if (iVar12 != 0) {
      Curl_failf(data,"Callback aborted");
      iVar16 = iVar12;
    }
    return iVar16;
  }
  p_Var2 = (data->set).fprogress;
  if (p_Var2 != (curl_progress_callback)0x0) {
    iVar12 = (*p_Var2)((data->set).progress_client,(double)(data->progress).size_dl,
                       (double)(data->progress).downloaded,(double)(data->progress).size_ul,
                       (double)(data->progress).uploaded);
    goto LAB_0010ab22;
  }
  if (lVar9 == lVar4) {
    return 0;
  }
  if (-1 < (char)uVar14) {
    if ((data->state).resume_from != 0) {
      curl_mfprintf((data->set).err,"** Resuming transfer from byte position %lld\n");
    }
    curl_mfprintf((data->set).err,
                  "  %% Total    %% Received %% Xferd  Average Speed   Time    Time     Time  Current\n                                 Dload  Upload   Total   Spent    Left  Speed\n"
                 );
    uVar14 = (data->progress).flags | 0x80;
    (data->progress).flags = uVar14;
  }
  if (((uVar14 & 0x20) == 0) || (lVar7 = (data->progress).ulspeed, lVar7 < 1)) {
    lVar7 = 0;
LAB_0010abfb:
    local_a8 = 0;
  }
  else {
    uVar8 = (data->progress).size_ul;
    lVar7 = (long)uVar8 / lVar7;
    if ((long)uVar8 < 0x2711) {
      if ((long)uVar8 < 1) goto LAB_0010abfb;
      cVar10 = (data->progress).uploaded * 100;
    }
    else {
      cVar10 = (data->progress).uploaded;
      uVar8 = uVar8 / 100;
    }
    local_a8 = cVar10 / (long)uVar8;
  }
  if (((uVar14 & 0x40) == 0) || (lVar9 = (data->progress).dlspeed, lVar9 < 1)) {
    lVar9 = 0;
LAB_0010ac68:
    local_b0 = 0;
  }
  else {
    uVar8 = (data->progress).size_dl;
    lVar9 = (long)uVar8 / lVar9;
    if ((long)uVar8 < 0x2711) {
      if ((long)uVar8 < 1) goto LAB_0010ac68;
      cVar10 = (data->progress).downloaded * 100;
    }
    else {
      cVar10 = (data->progress).downloaded;
      uVar8 = uVar8 / 100;
    }
    local_b0 = cVar10 / (long)uVar8;
  }
  if (lVar9 < lVar7) {
    lVar9 = lVar7;
  }
  cVar10 = 0;
  if (0 < lVar9) {
    cVar10 = lVar9 - (long)dVar17;
  }
  time2str(time_left,cVar10);
  time2str(time_total,lVar9);
  time2str(time_spent,(long)dVar17);
  uVar14 = (data->progress).flags;
  uVar8 = (&(data->progress).size_dl)[(ulong)((uVar14 & 0x40) == 0) * 2] +
          (&(data->progress).size_ul)[(ulong)((uVar14 & 0x20) == 0) * 2];
  lVar7 = (data->progress).uploaded + (data->progress).downloaded;
  if ((long)uVar8 < 0x2711) {
    if ((long)uVar8 < 1) {
      lVar7 = 0;
    }
    else {
      lVar7 = (lVar7 * 100) / (long)uVar8;
    }
  }
  else {
    lVar7 = lVar7 / (long)(uVar8 / 100);
  }
  whereto = (data->set).err;
  max5data(uVar8,max5[2]);
  max5data((data->progress).downloaded,max5[0]);
  max5data((data->progress).uploaded,max5[1]);
  max5data((data->progress).dlspeed,max5[3]);
  max5data((data->progress).ulspeed,max5[4]);
  max5data((data->progress).current_speed,max5[5]);
  curl_mfprintf(whereto,"\r%3lld %s  %3lld %s  %3lld %s  %s  %s %s %s %s %s",lVar7,max5 + 2,local_b0
                ,max5,local_a8,max5 + 1,max5 + 3,max5 + 4,time_total,time_spent,time_left,max5 + 5);
  fflush((FILE *)(data->set).err);
  return 0;
}

Assistant:

int Curl_pgrsUpdate(struct connectdata *conn)
{
  struct timeval now;
  int result;
  char max5[6][10];
  curl_off_t dlpercen=0;
  curl_off_t ulpercen=0;
  curl_off_t total_percen=0;
  curl_off_t total_transfer;
  curl_off_t total_expected_transfer;
  curl_off_t timespent;
  struct Curl_easy *data = conn->data;
  int nowindex = data->progress.speeder_c% CURR_TIME;
  int checkindex;
  int countindex; /* amount of seconds stored in the speeder array */
  char time_left[10];
  char time_total[10];
  char time_spent[10];
  curl_off_t ulestimate=0;
  curl_off_t dlestimate=0;
  curl_off_t total_estimate;
  bool shownow=FALSE;

  now = Curl_tvnow(); /* what time is it */

  /* The time spent so far (from the start) */
  data->progress.timespent = curlx_tvdiff_secs(now, data->progress.start);
  timespent = (curl_off_t)data->progress.timespent;

  /* The average download speed this far */
  data->progress.dlspeed = (curl_off_t)
    ((double)data->progress.downloaded/
     (data->progress.timespent>0?data->progress.timespent:1));

  /* The average upload speed this far */
  data->progress.ulspeed = (curl_off_t)
    ((double)data->progress.uploaded/
     (data->progress.timespent>0?data->progress.timespent:1));

  /* Calculations done at most once a second, unless end is reached */
  if(data->progress.lastshow != now.tv_sec) {
    shownow = TRUE;

    data->progress.lastshow = now.tv_sec;

    /* Let's do the "current speed" thing, which should use the fastest
       of the dl/ul speeds. Store the faster speed at entry 'nowindex'. */
    data->progress.speeder[ nowindex ] =
      data->progress.downloaded>data->progress.uploaded?
      data->progress.downloaded:data->progress.uploaded;

    /* remember the exact time for this moment */
    data->progress.speeder_time [ nowindex ] = now;

    /* advance our speeder_c counter, which is increased every time we get
       here and we expect it to never wrap as 2^32 is a lot of seconds! */
    data->progress.speeder_c++;

    /* figure out how many index entries of data we have stored in our speeder
       array. With N_ENTRIES filled in, we have about N_ENTRIES-1 seconds of
       transfer. Imagine, after one second we have filled in two entries,
       after two seconds we've filled in three entries etc. */
    countindex = ((data->progress.speeder_c>=CURR_TIME)?
                  CURR_TIME:data->progress.speeder_c) - 1;

    /* first of all, we don't do this if there's no counted seconds yet */
    if(countindex) {
      time_t span_ms;

      /* Get the index position to compare with the 'nowindex' position.
         Get the oldest entry possible. While we have less than CURR_TIME
         entries, the first entry will remain the oldest. */
      checkindex = (data->progress.speeder_c>=CURR_TIME)?
        data->progress.speeder_c%CURR_TIME:0;

      /* Figure out the exact time for the time span */
      span_ms = Curl_tvdiff(now,
                            data->progress.speeder_time[checkindex]);
      if(0 == span_ms)
        span_ms=1; /* at least one millisecond MUST have passed */

      /* Calculate the average speed the last 'span_ms' milliseconds */
      {
        curl_off_t amount = data->progress.speeder[nowindex]-
          data->progress.speeder[checkindex];

        if(amount > CURL_OFF_T_C(4294967) /* 0xffffffff/1000 */)
          /* the 'amount' value is bigger than would fit in 32 bits if
             multiplied with 1000, so we use the double math for this */
          data->progress.current_speed = (curl_off_t)
            ((double)amount/((double)span_ms/1000.0));
        else
          /* the 'amount' value is small enough to fit within 32 bits even
             when multiplied with 1000 */
          data->progress.current_speed = amount*CURL_OFF_T_C(1000)/span_ms;
      }
    }
    else
      /* the first second we use the main average */
      data->progress.current_speed =
        (data->progress.ulspeed>data->progress.dlspeed)?
        data->progress.ulspeed:data->progress.dlspeed;

  } /* Calculations end */

  if(!(data->progress.flags & PGRS_HIDE)) {
    /* progress meter has not been shut off */

    if(data->set.fxferinfo) {
      /* There's a callback set, call that */
      result= data->set.fxferinfo(data->set.progress_client,
                                  data->progress.size_dl,
                                  data->progress.downloaded,
                                  data->progress.size_ul,
                                  data->progress.uploaded);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }
    else if(data->set.fprogress) {
      /* The older deprecated callback is set, call that */
      result= data->set.fprogress(data->set.progress_client,
                                  (double)data->progress.size_dl,
                                  (double)data->progress.downloaded,
                                  (double)data->progress.size_ul,
                                  (double)data->progress.uploaded);
      if(result)
        failf(data, "Callback aborted");
      return result;
    }

    if(!shownow)
      /* only show the internal progress meter once per second */
      return 0;

    /* If there's no external callback set, use internal code to show
       progress */

    if(!(data->progress.flags & PGRS_HEADERS_OUT)) {
      if(data->state.resume_from) {
        fprintf(data->set.err,
                "** Resuming transfer from byte position %"
                CURL_FORMAT_CURL_OFF_T "\n", data->state.resume_from);
      }
      fprintf(data->set.err,
              "  %% Total    %% Received %% Xferd  Average Speed   "
              "Time    Time     Time  Current\n"
              "                                 Dload  Upload   "
              "Total   Spent    Left  Speed\n");
      data->progress.flags |= PGRS_HEADERS_OUT; /* headers are shown */
    }

    /* Figure out the estimated time of arrival for the upload */
    if((data->progress.flags & PGRS_UL_SIZE_KNOWN) &&
       (data->progress.ulspeed > CURL_OFF_T_C(0))) {
      ulestimate = data->progress.size_ul / data->progress.ulspeed;

      if(data->progress.size_ul > CURL_OFF_T_C(10000))
        ulpercen = data->progress.uploaded /
          (data->progress.size_ul/CURL_OFF_T_C(100));
      else if(data->progress.size_ul > CURL_OFF_T_C(0))
        ulpercen = (data->progress.uploaded*100) /
          data->progress.size_ul;
    }

    /* ... and the download */
    if((data->progress.flags & PGRS_DL_SIZE_KNOWN) &&
       (data->progress.dlspeed > CURL_OFF_T_C(0))) {
      dlestimate = data->progress.size_dl / data->progress.dlspeed;

      if(data->progress.size_dl > CURL_OFF_T_C(10000))
        dlpercen = data->progress.downloaded /
          (data->progress.size_dl/CURL_OFF_T_C(100));
      else if(data->progress.size_dl > CURL_OFF_T_C(0))
        dlpercen = (data->progress.downloaded*100) /
          data->progress.size_dl;
    }

    /* Now figure out which of them is slower and use that one for the
       total estimate! */
    total_estimate = ulestimate>dlestimate?ulestimate:dlestimate;

    /* create the three time strings */
    time2str(time_left, total_estimate > 0?(total_estimate - timespent):0);
    time2str(time_total, total_estimate);
    time2str(time_spent, timespent);

    /* Get the total amount of data expected to get transferred */
    total_expected_transfer =
      (data->progress.flags & PGRS_UL_SIZE_KNOWN?
       data->progress.size_ul:data->progress.uploaded)+
      (data->progress.flags & PGRS_DL_SIZE_KNOWN?
       data->progress.size_dl:data->progress.downloaded);

    /* We have transferred this much so far */
    total_transfer = data->progress.downloaded + data->progress.uploaded;

    /* Get the percentage of data transferred so far */
    if(total_expected_transfer > CURL_OFF_T_C(10000))
      total_percen = total_transfer /
        (total_expected_transfer/CURL_OFF_T_C(100));
    else if(total_expected_transfer > CURL_OFF_T_C(0))
      total_percen = (total_transfer*100) / total_expected_transfer;

    fprintf(data->set.err,
            "\r"
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  "
            "%3" CURL_FORMAT_CURL_OFF_T " %s  %s  %s %s %s %s %s",
            total_percen,  /* 3 letters */                /* total % */
            max5data(total_expected_transfer, max5[2]),   /* total size */
            dlpercen,      /* 3 letters */                /* rcvd % */
            max5data(data->progress.downloaded, max5[0]), /* rcvd size */
            ulpercen,      /* 3 letters */                /* xfer % */
            max5data(data->progress.uploaded, max5[1]),   /* xfer size */
            max5data(data->progress.dlspeed, max5[3]),    /* avrg dl speed */
            max5data(data->progress.ulspeed, max5[4]),    /* avrg ul speed */
            time_total,    /* 8 letters */                /* total time */
            time_spent,    /* 8 letters */                /* time spent */
            time_left,     /* 8 letters */                /* time left */
            max5data(data->progress.current_speed, max5[5]) /* current speed */
            );

    /* we flush the output stream to make it appear as soon as possible */
    fflush(data->set.err);

  } /* !(data->progress.flags & PGRS_HIDE) */

  return 0;
}